

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O0

string * Al::build_string<std::__cxx11::string>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string *in_RSI;
  string *in_RDI;
  ostringstream oss;
  ostringstream local_188 [376];
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string build_string(Args&&... args) {
  std::ostringstream oss;
  (oss << ... << args);
  return oss.str();
}